

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

bool __thiscall
cmArgumentParser<void>::Bind<bool>(cmArgumentParser<void> *this,string_view name,bool *ref)

{
  string_view name_00;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar1;
  anon_class_8_1_ba1d73f3 local_70;
  Action local_68;
  cmArgumentParser<void> *local_48;
  char *pcStack_40;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
  *local_38;
  byte local_30;
  bool *local_28;
  bool *ref_local;
  cmArgumentParser<void> *this_local;
  string_view name_local;
  
  pcStack_40 = name._M_str;
  local_48 = (cmArgumentParser<void> *)name._M_len;
  local_70.ref = ref;
  local_28 = ref;
  ref_local = (bool *)this;
  this_local = local_48;
  name_local._M_len = (size_t)pcStack_40;
  std::function<void(ArgumentParser::Instance&,void*)>::
  function<cmArgumentParser<void>::Bind<bool>(std::basic_string_view<char,std::char_traits<char>>,bool&)::_lambda(ArgumentParser::Instance&,void*)_1_,void>
            ((function<void(ArgumentParser::Instance&,void*)> *)&local_68,&local_70);
  name_00._M_str = pcStack_40;
  name_00._M_len = (size_t)local_48;
  pVar1 = ArgumentParser::ActionMap::Emplace(&this->Bindings,name_00,&local_68);
  local_38 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
              *)pVar1.first._M_current;
  local_30 = pVar1.second;
  std::function<void_(ArgumentParser::Instance_&,_void_*)>::~function(&local_68);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool Bind(cm::string_view name, T& ref)
  {
    return this->Bindings
      .Emplace(name,
               [&ref](ArgumentParser::Instance& instance, void*) {
                 instance.Bind(ref);
               })
      .second;
  }